

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameTitle.cpp
# Opt level: O0

void __thiscall GameTitle::GameTitle(GameTitle *this)

{
  GameTitle *this_local;
  
  Animation::Animation(&this->super_Animation);
  (this->super_Animation)._vptr_Animation = (_func_int **)&PTR_displayAnimation_00155428;
  word::word(&this->firstWord);
  word::word(&this->secondWord);
  word::word(&this->thirdWord);
  word::word(&this->fourthWord);
  std::__cxx11::string::string((string *)&this->title);
  std::__cxx11::string::operator=((string *)&(this->super_Animation).name,"GameTitle");
  std::__cxx11::string::operator=
            ((string *)&(this->super_Animation).description,
             "A slide-in text animation of the game title. \nIntended for the beginning of the game."
            );
  std::__cxx11::string::operator=((string *)&this->firstWord,"Private ");
  std::__cxx11::string::operator=((string *)&this->secondWord,"Keys, ");
  std::__cxx11::string::operator=((string *)&this->thirdWord,"Members ");
  std::__cxx11::string::operator=((string *)&this->fourthWord,"Only");
  std::__cxx11::string::operator=((string *)&this->title,"Private Keys, Members Only");
  return;
}

Assistant:

GameTitle::GameTitle() {
    // Set the default values of the base class members
    name = "GameTitle";
    description = "A slide-in text animation of the game title. \nIntended for the beginning of the game.";

    // Initialize the private members
    firstWord.text = "Private ";
    secondWord.text = "Keys, ";
    thirdWord.text = "Members ";
    fourthWord.text = "Only";

    title = "Private Keys, Members Only";
}